

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

void sdf_shape_done(SDF_Shape **shape)

{
  FT_Memory memory;
  SDF_Contour_ *pSVar1;
  SDF_Contour *in_RAX;
  SDF_Shape *P;
  SDF_Contour *pSVar2;
  SDF_Contour *temp;
  SDF_Contour *local_28;
  
  if (shape != (SDF_Shape **)0x0) {
    P = *shape;
    if ((P != (SDF_Shape *)0x0) && (memory = P->memory, memory != (FT_Memory)0x0)) {
      pSVar2 = P->contours;
      local_28 = in_RAX;
      if (pSVar2 != (SDF_Contour *)0x0) {
        do {
          pSVar1 = pSVar2->next;
          local_28 = pSVar2;
          sdf_contour_done(memory,&local_28);
          pSVar2 = pSVar1;
        } while (pSVar1 != (SDF_Contour_ *)0x0);
        P = *shape;
      }
      ft_mem_free(memory,P);
      *shape = (SDF_Shape *)0x0;
    }
  }
  return;
}

Assistant:

static void
  sdf_shape_done( SDF_Shape**  shape )
  {
    FT_Memory     memory;
    SDF_Contour*  contours;
    SDF_Contour*  temp;


    if ( !shape || !*shape )
      return;

    memory   = (*shape)->memory;
    contours = (*shape)->contours;

    if ( !memory )
      return;

    /* release all contours */
    while ( contours )
    {
      temp     = contours;
      contours = contours->next;

      sdf_contour_done( memory, &temp );
    }

    /* release the allocated shape struct  */
    FT_FREE( *shape );
  }